

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O0

Metric * __thiscall xLearn::Solver::create_metric(Solver *this)

{
  char *pcVar1;
  Metric *metric;
  allocator *entry_name;
  ObjectCreatorRegistry_xLearn_metric_registry *in_stack_ffffffffffffffb8;
  allocator local_31;
  string local_30 [32];
  Metric *local_10;
  
  GetRegistry_xLearn_metric_registry();
  pcVar1 = (char *)std::__cxx11::string::c_str();
  entry_name = &local_31;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,pcVar1,entry_name);
  local_10 = ObjectCreatorRegistry_xLearn_metric_registry::CreateObject
                       (in_stack_ffffffffffffffb8,(string *)entry_name);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  return local_10;
}

Assistant:

Metric* Solver::create_metric() {
  Metric* metric;
  metric = CREATE_METRIC(hyper_param_.metric.c_str());
  // Note that here we do not cheack metric == nullptr
  // this is because we can set metric to "none", which 
  // means that we don't print any metric info.
  return metric;
}